

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_Test
::
TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_Test
          (TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_Test
           *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).call3 = (MockCheckedExpectedCall *)0x0
  ;
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).call4 = (MockCheckedExpectedCall *)0x0
  ;
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).call1 = (MockCheckedExpectedCall *)0x0
  ;
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).call2 = (MockCheckedExpectedCall *)0x0
  ;
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).list = (MockExpectedCallsList *)0x0;
  TEST_GROUP_CppUTestGroupMockExpectedCallsList::TEST_GROUP_CppUTestGroupMockExpectedCallsList
            (&this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList);
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002b46a0;
  return;
}

Assistant:

TEST(MockExpectedCallsList, hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters)
{
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    call1->ignoreOtherParameters();
    call2->withParameter("param", 0);

    call1->finalizeActualCallMatch();

    CHECK(list->hasFinalizedMatchingExpectations());
}